

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UUID.cpp
# Opt level: O1

string * UUID::newUUID_abi_cxx11_(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  char cVar16;
  int iVar17;
  CryptoFactory *pCVar18;
  undefined4 extraout_var;
  byte *pbVar19;
  size_t sVar20;
  undefined4 *puVar21;
  string *in_RDI;
  ByteString uuid;
  char uuidStr [37];
  
  pCVar18 = CryptoFactory::i();
  iVar17 = (*pCVar18->_vptr_CryptoFactory[8])(pCVar18,1);
  ByteString::ByteString(&uuid);
  cVar16 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar17) + 0x10))
                     ((long *)CONCAT44(extraout_var,iVar17),&uuid,0x10);
  if (cVar16 != '\0') {
    pbVar19 = ByteString::operator[](&uuid,0);
    bVar1 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,1);
    bVar2 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,2);
    bVar3 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,3);
    bVar4 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,4);
    bVar5 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,5);
    bVar6 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,6);
    bVar7 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,7);
    bVar8 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,8);
    bVar9 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,9);
    bVar10 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,10);
    bVar11 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,0xb);
    bVar12 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,0xc);
    bVar13 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,0xd);
    bVar14 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,0xe);
    bVar15 = *pbVar19;
    pbVar19 = ByteString::operator[](&uuid,0xf);
    snprintf(uuidStr,0x25,"%02x%02x%02x%02x-%02x%02x-%02x%02x-%02x%02x-%02x%02x%02x%02x%02x%02x",
             (ulong)bVar1,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4,(ulong)bVar5,(ulong)bVar6,
             (ulong)bVar7,(ulong)bVar8,(ulong)bVar9,(ulong)bVar10,(ulong)bVar11,(ulong)bVar12,
             (ulong)bVar13,(ulong)bVar14,(ulong)bVar15,(ulong)*pbVar19);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    sVar20 = strlen(uuidStr);
    std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,uuidStr,uuidStr + sVar20);
    uuid._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&uuid.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    return in_RDI;
  }
  softHSMLog(3,"newUUID",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/UUID.cpp"
             ,0x33,"Fatal, could not generate random UUID");
  puVar21 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar21 = 0xffffffff;
  __cxa_throw(puVar21,&int::typeinfo,0);
}

Assistant:

std::string UUID::newUUID()
{
	RNG* rng = CryptoFactory::i()->getRNG();

	ByteString uuid;

	if (!rng->generateRandom(uuid, 16))
	{
		ERROR_MSG("Fatal, could not generate random UUID");

		throw -1;
	}

	// Convert it to a string
	char uuidStr[37];
	snprintf(uuidStr, sizeof(uuidStr),
		"%02x%02x%02x%02x-%02x%02x-%02x%02x-%02x%02x-%02x%02x%02x%02x%02x%02x",
		uuid[0], uuid[1], uuid[2], uuid[3],
		uuid[4], uuid[5],
		uuid[6], uuid[7],
		uuid[8], uuid[9],
		uuid[10], uuid[11], uuid[12], uuid[13], uuid[14], uuid[15]);

	return std::string(uuidStr);
}